

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O1

double EDLines::ComputeMinDistanceBetweenTwoLines(LineSegment *ls1,LineSegment *ls2,int *pwhich)

{
  uint uVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar3 = ls1->sx - ls2->sx;
  dVar5 = ls1->sy - ls2->sy;
  dVar3 = dVar3 * dVar3 + dVar5 * dVar5;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar5 = ls1->sx - ls2->ex;
  dVar6 = ls1->sy - ls2->ey;
  dVar5 = dVar5 * dVar5 + dVar6 * dVar6;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  dVar6 = ls1->ex - ls2->sx;
  dVar7 = ls1->ey - ls2->sy;
  dVar6 = dVar6 * dVar6 + dVar7 * dVar7;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  dVar7 = dVar5;
  if (dVar3 <= dVar5) {
    dVar7 = dVar3;
  }
  dVar4 = ls1->ex - ls2->ex;
  dVar8 = ls1->ey - ls2->ey;
  dVar4 = dVar4 * dVar4 + dVar8 * dVar8;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  dVar8 = dVar6;
  if (dVar7 <= dVar6) {
    dVar8 = dVar7;
  }
  if (pwhich != (int *)0x0) {
    uVar2 = 2;
    if (dVar7 <= dVar6) {
      uVar2 = (uint)(dVar5 < dVar3);
    }
    uVar1 = 3;
    if (dVar8 <= dVar4) {
      uVar1 = uVar2;
    }
    *pwhich = uVar1;
  }
  if (dVar8 <= dVar4) {
    dVar4 = dVar8;
  }
  return dVar4;
}

Assistant:

double EDLines::ComputeMinDistanceBetweenTwoLines(LineSegment * ls1, LineSegment * ls2, int * pwhich)
{
	double dx = ls1->sx - ls2->sx;
	double dy = ls1->sy - ls2->sy;
	double d = sqrt(dx*dx + dy*dy);
	double min = d;
	int which = SS;

	dx = ls1->sx - ls2->ex;
	dy = ls1->sy - ls2->ey;
	d = sqrt(dx*dx + dy*dy);
	if (d < min) { min = d; which = SE; }

	dx = ls1->ex - ls2->sx;
	dy = ls1->ey - ls2->sy;
	d = sqrt(dx*dx + dy*dy);
	if (d < min) { min = d; which = ES; }

	dx = ls1->ex - ls2->ex;
	dy = ls1->ey - ls2->ey;
	d = sqrt(dx*dx + dy*dy);
	if (d < min) { min = d; which = EE; }

	if (pwhich) *pwhich = which;
	return min;
}